

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O1

void __thiscall bandit::reporter::info::output_context_start_message(info *this)

{
  ostream *poVar1;
  _Elt_pointer pcVar2;
  long *local_a0;
  long local_98;
  long local_90 [2];
  long *local_80;
  long local_78;
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  poVar1 = (this->super_colored_base).stm_;
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,(char)this->indentation_ * '\x02');
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_40,local_38);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[4])(&local_60);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"begin ",6);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(&local_80);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_80,local_78);
  pcVar2 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,pcVar2[-1].desc._M_dataplus._M_p,pcVar2[-1].desc._M_string_length);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_a0,local_98);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

void output_context_start_message() {
        stm_
            << indent()
            << colorizer_.info()
            << "begin "
            << colorizer_.emphasize()
            << context_stack_.top().desc
            << colorizer_.reset()
            << std::endl;
        ++indentation_;
        stm_.flush();
      }